

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fatal.cpp
# Opt level: O2

void FatalException(void)

{
  SecureMemoryRegistry *this;
  
  softHSMLog(7,"FatalException",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/fatal.cpp"
             ,0x2d,"Fatal exception handler called");
  this = SecureMemoryRegistry::i();
  SecureMemoryRegistry::wipe(this);
  softHSMLog(3,"FatalException",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/fatal.cpp"
             ,0x38,"A fatal exception occurred; exiting...");
  exit(5);
}

Assistant:

void FatalException(void)
{
	try
	{
		DEBUG_MSG("Fatal exception handler called");
	}
	catch (...)
	{
	}

	// Wipe as much of the securely allocated memory as possible
	SecureMemoryRegistry::i()->wipe();

	try
	{
		ERROR_MSG("A fatal exception occurred; exiting...");
	}
	catch (...)
	{
	}

	exit(CKR_GENERAL_ERROR);
}